

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall Js::FunctionEntryPointInfo::OnCleanup(FunctionEntryPointInfo *this,bool isShutdown)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  FunctionBody *this_00;
  undefined4 extraout_var;
  FunctionEntryPointInfo *pFVar5;
  undefined7 in_register_00000031;
  ScriptContext *scriptContext;
  FunctionProxy *this_01;
  
  scriptContext = (ScriptContext *)CONCAT71(in_register_00000031,isShutdown);
  bVar2 = EntryPointInfo::IsCodeGenDone(&this->super_EntryPointInfo);
  if (bVar2) {
    this_01 = (this->functionProxy).ptr;
    if ((((this_01->functionInfo).ptr)->functionBodyImpl).ptr == (FunctionProxy *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      scriptContext = (ScriptContext *)0x23f1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x23f1,"(this->functionProxy->GetFunctionInfo()->HasBody())",
                                  "this->functionProxy->GetFunctionInfo()->HasBody()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
      this_01 = (this->functionProxy).ptr;
    }
    this_00 = FunctionProxy::GetFunctionBody(this_01);
    if (((this->super_EntryPointInfo).field_0x18 & 0x20) != 0) {
      iVar3 = (*(this->super_EntryPointInfo).super_ProxyEntryPointInfo.super_ExpirableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                [0xb])(this);
      FunctionBody::ReleaseLoopHeaders((FunctionBody *)CONCAT44(extraout_var,iVar3));
    }
    pFVar5 = FunctionProxy::
             GetAuxPtr<(Js::FunctionProxy::AuxPointerType)6,Js::FunctionEntryPointInfo*>
                       ((FunctionProxy *)this_00);
    if (pFVar5 == this) {
      scriptContext = (ScriptContext *)0x0;
      FunctionProxy::SetAuxPtr<(Js::FunctionProxy::AuxPointerType)6,Js::FunctionEntryPointInfo*>
                ((FunctionProxy *)this_00,(FunctionEntryPointInfo *)0x0);
    }
    EntryPointInfo::CleanupNativeCode(&this->super_EntryPointInfo,scriptContext);
  }
  (this->functionProxy).ptr = (FunctionProxy *)0x0;
  return;
}

Assistant:

void FunctionEntryPointInfo::OnCleanup(bool isShutdown)
    {
        if (this->IsCodeGenDone())
        {
            Assert(this->functionProxy->GetFunctionInfo()->HasBody());

#if ENABLE_NATIVE_CODEGEN
            if (this->IsNativeEntryPointProcessed())
            {
                JS_ETW(EtwTrace::LogMethodNativeUnloadEvent(this->functionProxy->GetFunctionBody(), this));
            }
#endif

            FunctionBody* functionBody = this->functionProxy->GetFunctionBody();
#ifdef ASMJS_PLAT
            if (this->GetIsTJMode())
            {
                // release LoopHeaders here if the entrypointInfo is TJ
                this->GetFunctionBody()->ReleaseLoopHeaders();
            }
#endif
            if(functionBody->GetSimpleJitEntryPointInfo() == this)
            {
                functionBody->SetSimpleJitEntryPointInfo(nullptr);
            }
#if ENABLE_NATIVE_CODEGEN
            CleanupNativeCode(this->functionProxy->GetScriptContext());
#endif
        }

        this->functionProxy = nullptr;
    }